

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  int iVar1;
  ImVec2 *pIVar2;
  ImVec2 *pIVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  if (0xffffff < col) {
    iVar6 = (this->_Path).Size;
    iVar1 = (this->_Path).Capacity;
    if (iVar6 == iVar1) {
      iVar6 = iVar6 + 1;
      if (iVar1 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar1 / 2 + iVar1;
      }
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar1 < iVar6) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar2,(long)(this->_Path).Size << 3);
        }
        ImGui::MemFree((this->_Path).Data);
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar6;
      }
    }
    iVar6 = (this->_Path).Size;
    (this->_Path).Size = iVar6 + 1;
    (this->_Path).Data[iVar6] = *pos0;
    PathBezierCurveTo(this,cp0,cp1,pos1,num_segments);
    uVar7 = 0;
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
    iVar6 = (this->_Path).Capacity;
    if (iVar6 < 0) {
      uVar5 = iVar6 / 2 + iVar6;
      if (0 < (int)uVar5) {
        uVar7 = (ulong)uVar5;
      }
      pIVar3 = (ImVec2 *)ImGui::MemAlloc(uVar7 * 8);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar2,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = (int)uVar7;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}